

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_set_cancel_compaction(filemgr *file,bool cancel)

{
  byte in_SIL;
  long in_RDI;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  if ((in_SIL & 1) == 0) {
    *(byte *)(in_RDI + 0xc) = *(byte *)(in_RDI + 0xc) & 0xbf;
  }
  else {
    *(byte *)(in_RDI + 0xc) = *(byte *)(in_RDI + 0xc) | 0x40;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return;
}

Assistant:

void filemgr_set_cancel_compaction(struct filemgr *file, bool cancel)
{
    spin_lock(&file->lock);
    if (cancel) {
        file->fflags |= FILEMGR_CANCEL_COMPACTION;
    } else {
        file->fflags &= ~FILEMGR_CANCEL_COMPACTION;
    }
    spin_unlock(&file->lock);
}